

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void increase_morale(tgestate_t *state,uint8_t delta)

{
  uint uVar1;
  uint8_t uVar2;
  undefined3 in_register_00000031;
  
  uVar1 = (uint)state->morale + CONCAT31(in_register_00000031,delta);
  uVar2 = 'p';
  if (uVar1 < 0x70) {
    uVar2 = (uint8_t)uVar1;
  }
  state->morale = uVar2;
  return;
}

Assistant:

void increase_morale(tgestate_t *state, uint8_t delta)
{
  int increased_morale;

  assert(state != NULL);
  assert(delta > 0);

  increased_morale = state->morale + delta;
  if (increased_morale >= morale_MAX)
    increased_morale = morale_MAX;

  assert(increased_morale >= morale_MIN);
  assert(increased_morale <= morale_MAX);

  state->morale = increased_morale;
}